

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

int __thiscall QtMWidgets::SliderPrivate::pixelPosToRangeValue(SliderPrivate *this,int p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QRect QVar7;
  
  QVar7 = grooveRect(this);
  iVar5 = QAbstractSlider::orientation();
  uVar2 = QVar7._8_8_ >> 0x20;
  if (iVar5 == 1) {
    uVar2 = QVar7._8_8_;
  }
  iVar1 = this->radius;
  uVar3 = QVar7._0_8_ >> 0x20;
  if (iVar5 == 1) {
    uVar3 = QVar7._0_8_;
  }
  iVar5 = QAbstractSlider::minimum();
  iVar6 = QAbstractSlider::maximum();
  bVar4 = (bool)QAbstractSlider::invertedAppearance();
  iVar5 = QStyle::sliderValueFromPosition
                    (iVar5,iVar6,p - (int)uVar3,(int)uVar2 - ((int)uVar3 + iVar1 * 2),bVar4);
  return iVar5;
}

Assistant:

int
SliderPrivate::pixelPosToRangeValue( int p ) const
{
	const QRect gr = grooveRect();

	int sliderMin = 0, sliderMax = 0;

	if( q->orientation() == Qt::Horizontal )
	{
		sliderMin = gr.x();
		sliderMax = gr.right() - 2 * radius;
	}
	else
	{
		sliderMin = gr.y();
		sliderMax = gr.bottom() - 2 * radius;
	}

	return QStyle::sliderValueFromPosition( q->minimum(), q->maximum(),
		p - sliderMin, sliderMax - sliderMin, q->invertedAppearance() );
}